

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O1

int bitmap_and_compl(bitmap_t dst,bitmap_t src1,bitmap_t src2)

{
  byte bVar1;
  bitmap_t pVVar2;
  bitmap_t pVVar3;
  bitmap_el_t *pbVar4;
  bitmap_el_t *pbVar5;
  MIR_context_t ctx;
  int extraout_EAX;
  int extraout_EAX_00;
  bitmap_t pVVar6;
  char *pcVar7;
  bitmap_t unaff_RBX;
  bitmap_t pVVar8;
  bitmap_t nb;
  char *pcVar9;
  bitmap_t pVVar10;
  bitmap_el_t bVar11;
  ulong uVar12;
  bitmap_t unaff_R14;
  bitmap_t unaff_R15;
  
  nb = src1;
  pVVar10 = dst;
  if (src1 == (bitmap_t)0x0) {
LAB_00167ddf:
    src2 = unaff_R14;
    bitmap_and_compl_cold_4();
  }
  else if (src2 != (bitmap_t)0x0) {
    pVVar2 = (bitmap_t)src1->els_num;
    pVVar3 = (bitmap_t)src2->els_num;
    pVVar8 = pVVar3;
    if (pVVar3 < pVVar2) {
      pVVar8 = pVVar2;
    }
    nb = (bitmap_t)((long)pVVar8 << 6);
    bitmap_expand(dst,(size_t)nb);
    if (dst == (bitmap_t)0x0) goto LAB_00167de9;
    pbVar4 = dst->varr;
    if (pVVar8 == (bitmap_t)0x0) {
      pVVar6 = (bitmap_t)0x0;
    }
    else {
      pbVar5 = src1->varr;
      nb = (bitmap_t)src2->varr;
      pVVar10 = (bitmap_t)0x0;
      pVVar6 = (bitmap_t)0x0;
      do {
        if (pVVar10 < pVVar2) {
          bVar11 = pbVar5[(long)pVVar10];
        }
        else {
          bVar11 = 0;
        }
        uVar12 = 0xffffffffffffffff;
        if (pVVar10 < pVVar3) {
          uVar12 = ~(&nb->els_num)[(long)pVVar10];
        }
        pbVar4[(long)pVVar10] = uVar12 & bVar11;
        pVVar10 = (bitmap_t)((long)&pVVar10->els_num + 1);
        if ((uVar12 & bVar11) != 0) {
          pVVar6 = pVVar10;
        }
      } while (pVVar8 != pVVar10);
    }
    if ((pbVar4 != (bitmap_el_t *)0x0) && (pVVar6 <= (bitmap_t)dst->els_num)) {
      dst->els_num = (size_t)pVVar6;
      return (int)pbVar4;
    }
    bitmap_and_compl_cold_1();
    unaff_RBX = dst;
    unaff_R14 = src2;
    unaff_R15 = src1;
    goto LAB_00167ddf;
  }
  src1 = unaff_R15;
  dst = unaff_RBX;
  bitmap_and_compl_cold_3();
LAB_00167de9:
  bitmap_and_compl_cold_2();
  if (((FILE *)pVVar10[1].els_num != (FILE *)0x0) && (1 < (int)pVVar10[1].size)) {
    ctx = (MIR_context_t)pVVar10->els_num;
    bVar1 = *(byte *)((long)&nb->size + 1);
    pcVar9 = "may/must alloca ";
    if ((bVar1 & 3) == 0) {
      pcVar9 = "must alloca";
    }
    pcVar7 = "";
    if (bVar1 != 0) {
      pcVar7 = pcVar9;
    }
    pcVar9 = "const val";
    if ((char)nb->size == '\0') {
      pcVar9 = "val";
    }
    fprintf((FILE *)pVVar10[1].els_num,"%s%s=%lld for insn %lu:",pcVar7,pcVar9,nb[1].els_num,
            (ulong)*(uint *)((long)&nb->size + 4),dst,src2,src1);
    MIR_output_insn(ctx,(FILE *)pVVar10[1].els_num,(MIR_insn_t_conflict)nb->els_num,
                    (MIR_func_t)pVVar10->varr[8],1);
    return extraout_EAX_00;
  }
  return extraout_EAX;
}

Assistant:

static inline int bitmap_and_compl (bitmap_t dst, bitmap_t src1, bitmap_t src2) {
  return bitmap_op2 (dst, src1, src2, bitmap_el_and_compl);
}